

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O1

Xt __thiscall cppforth::Forth::blWordFind(Forth *this,string *wordBuffer)

{
  char cVar1;
  pointer pcVar2;
  pointer plVar3;
  _Alloc_hider __s2;
  byte bVar4;
  Cell CVar5;
  Cell CVar6;
  int iVar7;
  Xt XVar8;
  size_t sVar9;
  string *__range3;
  pointer plVar10;
  char cVar11;
  long lVar12;
  string localName;
  string local_58;
  string *local_38;
  
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
            (wordBuffer,0,'\0');
  CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar5 - CVar6)) {
    while( true ) {
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar4 = dataSpaceAt(this,CVar5 + CVar6);
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if (((int)(CVar5 - CVar6) < 1) ||
         ((bVar4 != 0x20 && (iVar7 = isspace((uint)bVar4), iVar7 == 0)))) break;
      incSourceBufferOffset(this);
    }
  }
  CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
  CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
  if (0 < (int)(CVar5 - CVar6)) {
    while( true ) {
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      if ((int)(CVar5 - CVar6) < 1) break;
      CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceAddress);
      CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
      bVar4 = dataSpaceAt(this,CVar5 + CVar6);
      if ((bVar4 == 0x20) || (iVar7 = isspace((uint)bVar4), iVar7 != 0)) break;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (wordBuffer,bVar4);
      incSourceBufferOffset(this);
    }
    CVar5 = dataSpaceAtCell(this,this->VarOffsetSourceSize);
    CVar6 = dataSpaceAtCell(this,this->VarOffsetSourceOffset);
    if (0 < (int)(CVar5 - CVar6)) {
      incSourceBufferOffset(this);
    }
  }
  if (wordBuffer->_M_string_length < 0x100) {
    if ((this->localVariables).
        super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        (this->localVariables).
        super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
      pcVar2 = (wordBuffer->_M_dataplus)._M_p;
      local_38 = wordBuffer;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_58,pcVar2,pcVar2 + wordBuffer->_M_string_length);
      __s2._M_p = local_58._M_dataplus._M_p;
      if (local_58._M_string_length != 0) {
        sVar9 = 0;
        do {
          cVar1 = local_58._M_dataplus._M_p[sVar9];
          cVar11 = cVar1 + -0x20;
          if (0x19 < (byte)(cVar1 + 0x9fU)) {
            cVar11 = cVar1;
          }
          local_58._M_dataplus._M_p[sVar9] = cVar11;
          sVar9 = sVar9 + 1;
        } while (local_58._M_string_length != sVar9);
      }
      plVar10 = (this->localVariables).
                super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                ._M_impl.super__Vector_impl_data._M_start;
      plVar3 = (this->localVariables).
               super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (plVar10 != plVar3) {
        lVar12 = -(long)plVar10;
        do {
          sVar9 = (plVar10->localName)._M_string_length;
          if ((sVar9 == local_58._M_string_length) &&
             ((sVar9 == 0 ||
              (iVar7 = bcmp((plVar10->localName)._M_dataplus._M_p,__s2._M_p,sVar9), iVar7 == 0)))) {
            data(this,1);
            data(this,(int)((ulong)-((long)&(((this->localVariables).
                                              super__Vector_base<cppforth::Forth::localVariable,_std::allocator<cppforth::Forth::localVariable>_>
                                              ._M_impl.super__Vector_impl_data._M_start)->localName)
                                            ._M_dataplus._M_p + lVar12) >> 3) * -0x33333333);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_58._M_dataplus._M_p != &local_58.field_2) {
              operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
            }
            return 0x1a;
          }
          plVar10 = plVar10 + 1;
          lVar12 = lVar12 + -0x28;
        } while (plVar10 != plVar3);
      }
      wordBuffer = local_38;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        wordBuffer = local_38;
      }
    }
    XVar8 = findDefinition(this,wordBuffer);
  }
  else {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"WORD: very long word ","");
    throwMessage(this,&local_58,errorParsedStringOverflow);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    XVar8 = 0;
  }
  return XVar8;
}

Assistant:

Xt blWordFind(std::string &wordBuffer) {

			auto delim = ' ';
			/****

			I need a buffer to store the result of the Forth `WORD` word.  As with the
			input buffer, I use a `std::string` so I don't need to worry about memory
			management.

			Note that while this is a `std::string`, its format is not a typical strings.
			The buffer returned by `WORD` has the word length as its first character.
			That is, it is a Forth _counted string_.

			****/
			wordBuffer.resize(0);  // First char of buffer is length.
			
			// Skip leading delimiters
			if (getSourceBufferRemain() > 0) {
				auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				while (getSourceBufferRemain() > 0 && ((currentChar == delim)
					|| (delim == ' ' && isspace(static_cast<unsigned char>(currentChar)))
					)) {
					incSourceBufferOffset();
					currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());
				}
			}
			if (getSourceBufferRemain() > 0) {
				// Copy characters until we see the delimiter again.
				while (getSourceBufferRemain() >0 ) {
					auto currentChar = getDataChar(getSourceAddress() + getSourceBufferOffset());	
					if( currentChar != delim
					&& !(delim == ' ' && (isspace(static_cast<unsigned char>(currentChar))))
					) {
					wordBuffer.push_back(static_cast<unsigned char>(currentChar));
					incSourceBufferOffset();
					} else {
						break;
					}
				}
				// source point to the delimiter char, skip it.
				if (getSourceBufferRemain() >0 ) {
					incSourceBufferOffset(); 
				}
			}
			if (wordBuffer.size() > 255){
				// @bug it is catched below
				throwMessage(std::string("WORD: very long word "), errorParsedStringOverflow);
				return 0;
			}
			if(localVariables.size()>0){
				std::string localName{wordBuffer};
				for(auto &c: localName) c=toupper_ascii(c);
				for(auto it=localVariables.begin(),itEnd=localVariables.end();it!=itEnd;++it){
					if((*it).localName==localName){
						// compale address of local variable
						// and retrun XT of FETCH @
						data(doLiteralXt);
						data(std::distance(localVariables.begin(),it));
						return pickReturnStackXt ;
					}
				}		
			}
			auto word = findDefinition(wordBuffer);
			return word;
			
		}